

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIListBox::recalculateItemHeight(CGUIListBox *this)

{
  int iVar1;
  long *plVar2;
  IGUIFont *pIVar3;
  IGUIFont *pIVar4;
  int extraout_var;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  plVar2 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  pIVar4 = this->Font;
  pIVar3 = (IGUIFont *)(**(code **)(*plVar2 + 0x30))(plVar2,0);
  if (pIVar4 != pIVar3) {
    pIVar4 = this->Font;
    if (pIVar4 != (IGUIFont *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar4->_vptr_IGUIFont + (long)pIVar4->_vptr_IGUIFont[-3]));
    }
    pIVar4 = (IGUIFont *)(**(code **)(*plVar2 + 0x30))(plVar2,0);
    this->Font = pIVar4;
    if (this->ItemHeightOverride == 0) {
      this->ItemHeight = 0;
      if (pIVar4 == (IGUIFont *)0x0) goto LAB_002328e4;
      (*pIVar4->_vptr_IGUIFont[1])(pIVar4,L"A");
      this->ItemHeight = extraout_var + 4;
      pIVar4 = this->Font;
    }
    else if (pIVar4 == (IGUIFont *)0x0) goto LAB_002328e4;
    *(int *)(&pIVar4->field_0x10 + (long)pIVar4->_vptr_IGUIFont[-3]) =
         *(int *)(&pIVar4->field_0x10 + (long)pIVar4->_vptr_IGUIFont[-3]) + 1;
  }
LAB_002328e4:
  lVar5 = (long)(this->Items).m_data.
                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->Items).m_data.
                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (int)(lVar5 / 0x48) * this->ItemHeight;
  this->TotalItemHeight = iVar1;
  uVar6 = (*(int *)&this->field_0x44 - *(int *)&this->field_0x4c) + iVar1;
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = uVar6;
  }
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])
            (this->ScrollBar,(ulong)uVar7,lVar5 % 0x48);
  uVar7 = 1;
  if (1 < this->ItemHeight) {
    uVar7 = this->ItemHeight;
  }
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x29])
            (this->ScrollBar,(ulong)uVar7);
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2b])
            (this->ScrollBar,(ulong)(uVar7 * 2));
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xf])
            (this->ScrollBar,
             (ulong)(*(int *)&this->field_0x4c - *(int *)&this->field_0x44 < this->TotalItemHeight))
  ;
  return;
}

Assistant:

void CGUIListBox::recalculateItemHeight()
{
	IGUISkin *skin = Environment->getSkin();

	if (Font != skin->getFont()) {
		if (Font)
			Font->drop();

		Font = skin->getFont();
		if (0 == ItemHeightOverride)
			ItemHeight = 0;

		if (Font) {
			if (0 == ItemHeightOverride)
				ItemHeight = Font->getDimension(L"A").Height + 4;

			Font->grab();
		}
	}

	TotalItemHeight = ItemHeight * Items.size();
	ScrollBar->setMax(core::max_(0, TotalItemHeight - AbsoluteRect.getHeight()));
	s32 minItemHeight = ItemHeight > 0 ? ItemHeight : 1;
	ScrollBar->setSmallStep(minItemHeight);
	ScrollBar->setLargeStep(2 * minItemHeight);

	if (TotalItemHeight <= AbsoluteRect.getHeight())
		ScrollBar->setVisible(false);
	else
		ScrollBar->setVisible(true);
}